

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ES5Array.cpp
# Opt level: O0

BOOL __thiscall
Js::ES5Array::SetPropertyWithAttributes
          (ES5Array *this,PropertyId propertyId,Var value,PropertyAttributes attributes,
          PropertyValueInfo *info,PropertyOperationFlags flags,SideEffects possibleSideEffects)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  uint32 uVar4;
  BOOL BVar5;
  undefined4 *puVar6;
  ScriptContext *scriptContext;
  DynamicTypeHandler *pDVar7;
  uint32 newLen;
  PropertyOperationFlags flags_local;
  PropertyValueInfo *info_local;
  PropertyAttributes attributes_local;
  Var value_local;
  PropertyId propertyId_local;
  ES5Array *this_local;
  
  if (propertyId != 0xd1) {
    BVar5 = Js::JavascriptArray::SetPropertyWithAttributes
                      (&this->super_JavascriptArray,propertyId,value,attributes,info,flags,
                       possibleSideEffects);
    return BVar5;
  }
  if (attributes != '\x04') {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ES5Array.cpp"
                                ,0xe9,"(attributes == 0x04)","attributes == PropertyWritable");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  iVar3 = (*(this->super_JavascriptArray).super_ArrayObject.super_DynamicObject.
            super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[0x30])(this,0xd1);
  if (((iVar3 == 0) ||
      (iVar3 = (*(this->super_JavascriptArray).super_ArrayObject.super_DynamicObject.
                 super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
                 _vptr_IRecyclerVisitedObject[0x31])(this,0xd1), iVar3 != 0)) ||
     (iVar3 = (*(this->super_JavascriptArray).super_ArrayObject.super_DynamicObject.
                super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject[0x32])(this,0xd1), iVar3 != 0)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ES5Array.cpp"
                                ,0xea,
                                "(IsWritable(propertyId) && !IsConfigurable(propertyId) && !IsEnumerable(propertyId))"
                                ,
                                "IsWritable(propertyId) && !IsConfigurable(propertyId) && !IsEnumerable(propertyId)"
                               );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  scriptContext = RecyclableObject::GetScriptContext((RecyclableObject *)this);
  uVar4 = ToLengthValue(value,scriptContext);
  pDVar7 = DynamicObject::GetTypeHandler((DynamicObject *)this);
  (*pDVar7->_vptr_DynamicTypeHandler[0x42])(pDVar7,this,(ulong)uVar4,0);
  return 1;
}

Assistant:

BOOL ES5Array::SetPropertyWithAttributes(PropertyId propertyId, Var value, PropertyAttributes attributes, PropertyValueInfo* info, PropertyOperationFlags flags, SideEffects possibleSideEffects)
    {
        if (propertyId == PropertyIds::length)
        {
            Assert(attributes == PropertyWritable);
            Assert(IsWritable(propertyId) && !IsConfigurable(propertyId) && !IsEnumerable(propertyId));

            uint32 newLen = ToLengthValue(value, GetScriptContext());
            GetTypeHandler()->SetLength(this, newLen, PropertyOperation_None);
            return true;
        }

        return __super::SetPropertyWithAttributes(propertyId, value, attributes, info, flags, possibleSideEffects);
    }